

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

void ApiLayerManifestFile::CreateIfValid
               (ManifestFileType type,string *filename,
               vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
               *manifest_files)

{
  char cVar1;
  ostream *poVar2;
  allocator local_3f9;
  string local_3f8;
  string local_3d8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_3b8;
  ostringstream error_ss;
  ifstream json_stream;
  
  std::ifstream::ifstream(&json_stream,(string *)filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::string::string
              ((string *)&local_3f8,"ApiLayerManifestFile::CreateIfValid ",(allocator *)&local_3d8);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&error_ss,(string *)&local_3f8,_S_out);
    std::__cxx11::string::~string((string *)&local_3f8);
    poVar2 = std::operator<<((ostream *)&error_ss,"failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,".  Does it exist?");
    std::__cxx11::string::string((string *)&local_3f8,"",&local_3f9);
    std::__cxx11::stringbuf::str();
    local_3b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&local_3f8,&local_3d8,&local_3b8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_ss);
  }
  else {
    CreateIfValid(type,filename,(istream *)&json_stream,LocateLibraryRelativeToJson,manifest_files);
  }
  std::ifstream::~ifstream(&json_stream);
  return;
}

Assistant:

void ApiLayerManifestFile::CreateIfValid(ManifestFileType type, const std::string &filename,
                                         std::vector<std::unique_ptr<ApiLayerManifestFile>> &manifest_files) {
    std::ifstream json_stream(filename, std::ifstream::in);
    if (!json_stream.is_open()) {
        std::ostringstream error_ss("ApiLayerManifestFile::CreateIfValid ");
        error_ss << "failed to open " << filename << ".  Does it exist?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }
    CreateIfValid(type, filename, json_stream, &ApiLayerManifestFile::LocateLibraryRelativeToJson, manifest_files);
}